

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O0

void __thiscall pager::~pager(pager *this)

{
  pager *this_local;
  
  r_memory_map::~r_memory_map(&this->_mm);
  r_file::~r_file(&this->_f);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

pager::~pager() noexcept
{
}